

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
AsyncRgbLedSimulationDataGenerator::Initialize
          (AsyncRgbLedSimulationDataGenerator *this,U32 simulation_sample_rate,
          AsyncRgbLedAnalyzerSettings *settings)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  BitState BVar4;
  
  srand(0x2a);
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  bVar1 = AsyncRgbLedAnalyzerSettings::BitSize(settings);
  this->mMaximumChannelValue = ~(-1 << (bVar1 & 0x1f));
  ClockGenerator::Init(1.0,(int)this + 0x10);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mLEDSimulationData);
  BVar4 = (BitState)&this->mLEDSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar4);
  SimulationChannelDescriptor::SetInitialBitState(BVar4);
  bVar2 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported(this->mSettings);
  if (bVar2) {
    if (this->mSimulationSampleRateHz < 0x112a881) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Disabling high-speed data generation due to simulated sample rate");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    this->mDoGenerateHighSpeedMode = true;
  }
  return;
}

Assistant:

void AsyncRgbLedSimulationDataGenerator::Initialize( U32 simulation_sample_rate, AsyncRgbLedAnalyzerSettings* settings )
{
    // Initialize the random number generator with a literal seed to obtain repeatability
    // Change this for srand(time(NULL)) for "truly" random sequences
    // NOTICE rand() an srand() are *not* thread safe
    srand( 42 );

    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mMaximumChannelValue = ( 1 << mSettings->BitSize() ) - 1;

    // TODO pass in the analyzer and call GetMinimumSampleRate?
    const double clockFrequencyUnused = 1.0;
    mClockGenerator.Init( clockFrequencyUnused, mSimulationSampleRateHz );

    mLEDSimulationData.SetChannel( mSettings->mInputChannel );
    mLEDSimulationData.SetSampleRate( simulation_sample_rate );
    mLEDSimulationData.SetInitialBitState( BIT_LOW );

    if( mSettings->IsHighSpeedSupported() )
    {
        // check if the requested sample rate is high enough
        if( mSimulationSampleRateHz > 18000000 )
        {
            mDoGenerateHighSpeedMode = true;
        }
        else
        {
            std::cerr << "Disabling high-speed data generation due to simulated sample rate" << std::endl;
        }
    }
}